

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlPointerListPtr xmlPointerListCreate(int initialSize)

{
  xmlPointerListPtr list;
  
  list = (xmlPointerListPtr)(*xmlMalloc)(0x10);
  if (list == (xmlPointerListPtr)0x0) {
    list = (xmlPointerListPtr)0x0;
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"xmlPointerListCreate: allocating item\n");
  }
  else {
    list->items = (void **)0x0;
    list->number = 0;
    list->size = 0;
    xmlPointerListAddSize(list,(void *)0x0,10);
    list->number = 0;
  }
  return list;
}

Assistant:

static xmlPointerListPtr
xmlPointerListCreate(int initialSize)
{
    xmlPointerListPtr ret;

    ret = xmlMalloc(sizeof(xmlPointerList));
    if (ret == NULL) {
	xmlXPathErrMemory(NULL,
	    "xmlPointerListCreate: allocating item\n");
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlPointerList));
    if (initialSize > 0) {
	xmlPointerListAddSize(ret, NULL, initialSize);
	ret->number = 0;
    }
    return (ret);
}